

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_raster.cpp
# Opt level: O0

void __thiscall
QRasterPaintEnginePrivate::rasterize
          (QRasterPaintEnginePrivate *this,QT_FT_Outline *outline,ProcessSpans callback,
          void *userData,QRasterBuffer *param_5)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  QRasterPaintEngineState *this_00;
  QRasterizer *pQVar5;
  uchar *puVar6;
  TRaster_ **ppTVar7;
  void *in_RCX;
  ProcessSpans in_RDX;
  long in_RSI;
  QRasterPaintEnginePrivate *in_RDI;
  long in_FS_OFFSET;
  int rendered_spans;
  int error;
  bool done;
  void *data;
  uchar *rasterPoolOnHeap;
  uchar *rasterPoolBase;
  int rasterPoolSize;
  FillRule fillRule;
  QRasterPaintEngineState *s;
  QRasterPaintEngine *q;
  QT_FT_Raster_Params rasterParams;
  QT_FT_BBox clip_box;
  uchar rasterPoolOnStack [8207];
  QRect *in_stack_ffffffffffffdeb8;
  code *in_stack_ffffffffffffdec0;
  code *in_stack_ffffffffffffdec8;
  code *in_stack_ffffffffffffded0;
  code *raster;
  int local_2104;
  uchar *local_20f0;
  undefined8 in_stack_ffffffffffffdf18;
  FillRule fillRule_00;
  undefined4 in_stack_ffffffffffffdf20;
  int iVar8;
  char local_20a0 [32];
  undefined8 local_2080 [2];
  uint local_2070;
  ProcessSpans local_2068;
  undefined8 local_2060;
  undefined8 local_2058;
  undefined8 local_2050;
  undefined8 local_2040;
  undefined8 local_2038;
  int local_2030;
  undefined8 local_2028;
  undefined8 local_2020;
  uchar local_2018 [8208];
  long local_8;
  
  fillRule_00 = (FillRule)((ulong)in_stack_ffffffffffffdf18 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_RDX != (ProcessSpans)0x0) && (in_RSI != 0)) {
    q_func(in_RDI);
    this_00 = QRasterPaintEngine::state((QRasterPaintEngine *)0x565175);
    if ((*(ushort *)&this_00->field_12 >> 3 & 1) == 0) {
      pQVar5 = QScopedPointer<QRasterizer,_QScopedPointerDeleter<QRasterizer>_>::operator->
                         (&in_RDI->rasterizer);
      QRasterizer::setAntialiased(pQVar5,(*(ushort *)&this_00->field_12 >> 3 & 1) != 0);
      pQVar5 = QScopedPointer<QRasterizer,_QScopedPointerDeleter<QRasterizer>_>::operator->
                         (&in_RDI->rasterizer);
      QRasterizer::setClipRect(pQVar5,&in_RDI->deviceRect);
      pQVar5 = QScopedPointer<QRasterizer,_QScopedPointerDeleter<QRasterizer>_>::operator->
                         (&in_RDI->rasterizer);
      QRasterizer::initialize(pQVar5,in_RDX,in_RCX);
      uVar2 = (uint)(*(int *)(in_RSI + 0x20) == 0);
      QScopedPointer<QRasterizer,_QScopedPointerDeleter<QRasterizer>_>::operator->
                (&in_RDI->rasterizer);
      QRasterizer::rasterize
                ((QRasterizer *)this_00,(QT_FT_Outline *)CONCAT44(uVar2,in_stack_ffffffffffffdf20),
                 fillRule_00);
    }
    else {
      iVar8 = 0x2000;
      puVar6 = alignAddress(local_2018,0xf);
      local_20f0 = (uchar *)0x0;
      ppTVar7 = QScopedPointer<TRaster__*,_QScopedPointerDeleter<TRaster__*>_>::data
                          (&in_RDI->grayRaster);
      gray_raster_reset(*ppTVar7,(char *)puVar6,(long)iVar8);
      local_2028 = &DAT_aaaaaaaaaaaaaaaa;
      local_2020 = &DAT_aaaaaaaaaaaaaaaa;
      iVar3 = QRect::x((QRect *)0x565306);
      local_2028 = (undefined1 *)CONCAT44(local_2028._4_4_,iVar3);
      iVar3 = QRect::y((QRect *)0x56531e);
      local_2028 = (undefined1 *)CONCAT44(iVar3,(undefined4)local_2028);
      iVar3 = QRect::x((QRect *)0x565336);
      iVar4 = QRect::width(in_stack_ffffffffffffdeb8);
      local_2020 = (undefined1 *)CONCAT44(local_2020._4_4_,iVar3 + iVar4);
      iVar3 = QRect::y((QRect *)0x56536b);
      iVar4 = QRect::height(in_stack_ffffffffffffdeb8);
      local_2020 = (undefined1 *)CONCAT44(iVar3 + iVar4,(undefined4)local_2020);
      memset(local_2080,0xaa,0x58);
      local_2080[0] = 0;
      local_2070 = 4;
      local_2068 = (ProcessSpans)0x0;
      local_2060 = 0;
      local_2058 = 0;
      local_2050 = 0;
      local_2040 = local_2028;
      local_2038 = local_2020;
      bVar1 = false;
      local_2104 = 0;
      while (!bVar1) {
        local_2070 = local_2070 | 3;
        local_2030 = local_2104;
        raster = gray_raster_render;
        local_2068 = in_RDX;
        QScopedPointer<TRaster__*,_QScopedPointerDeleter<TRaster__*>_>::data(&in_RDI->grayRaster);
        iVar3 = gray_raster_render((QT_FT_Raster)raster,
                                   (QT_FT_Raster_Params *)in_stack_ffffffffffffded0);
        if (iVar3 == -6) {
          iVar8 = iVar8 << 1;
          if (0x100000 < iVar8) {
            QMessageLogger::QMessageLogger
                      ((QMessageLogger *)in_stack_ffffffffffffded0,(char *)in_stack_ffffffffffffdec8
                       ,(int)((ulong)in_stack_ffffffffffffdec0 >> 0x20),
                       (char *)in_stack_ffffffffffffdeb8);
            QMessageLogger::warning(local_20a0,"QPainter: Rasterization of primitive failed");
            break;
          }
          ppTVar7 = QScopedPointer<TRaster__*,_QScopedPointerDeleter<TRaster__*>_>::data
                              (&in_RDI->grayRaster);
          iVar3 = q_gray_rendered_spans(*ppTVar7);
          local_2104 = iVar3 + local_2104;
          free(local_20f0);
          local_20f0 = (uchar *)malloc((long)(iVar8 + 0xf));
          qt_noop();
          puVar6 = alignAddress(local_20f0,0xf);
          in_stack_ffffffffffffdec0 = gray_raster_done;
          ppTVar7 = QScopedPointer<TRaster__*,_QScopedPointerDeleter<TRaster__*>_>::data
                              (&in_RDI->grayRaster);
          (*in_stack_ffffffffffffdec0)(*ppTVar7);
          in_stack_ffffffffffffdec8 = gray_raster_new;
          ppTVar7 = QScopedPointer<TRaster__*,_QScopedPointerDeleter<TRaster__*>_>::data
                              (&in_RDI->grayRaster);
          (*in_stack_ffffffffffffdec8)(ppTVar7);
          in_stack_ffffffffffffded0 = gray_raster_reset;
          ppTVar7 = QScopedPointer<TRaster__*,_QScopedPointerDeleter<TRaster__*>_>::data
                              (&in_RDI->grayRaster);
          (*in_stack_ffffffffffffded0)(*ppTVar7,puVar6,(long)iVar8);
        }
        else {
          bVar1 = true;
        }
      }
      free(local_20f0);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QRasterPaintEnginePrivate::rasterize(QT_FT_Outline *outline,
                                          ProcessSpans callback,
                                          void *userData, QRasterBuffer *)
{
    if (!callback || !outline)
        return;

    Q_Q(QRasterPaintEngine);
    QRasterPaintEngineState *s = q->state();

    if (!s->flags.antialiased) {
        rasterizer->setAntialiased(s->flags.antialiased);
        rasterizer->setClipRect(deviceRect);
        rasterizer->initialize(callback, userData);

        const Qt::FillRule fillRule = outline->flags == QT_FT_OUTLINE_NONE
                                      ? Qt::WindingFill
                                      : Qt::OddEvenFill;

        rasterizer->rasterize(outline, fillRule);
        return;
    }

    // Initial size for raster pool is MINIMUM_POOL_SIZE so as to
    // minimize memory reallocations. However if initial size for
    // raster pool is changed for lower value, reallocations will
    // occur normally.
    int rasterPoolSize = MINIMUM_POOL_SIZE;
    Q_DECL_UNINITIALIZED uchar rasterPoolOnStack[MINIMUM_POOL_SIZE + 0xf];
    uchar *rasterPoolBase = alignAddress(rasterPoolOnStack, 0xf);
    uchar *rasterPoolOnHeap = nullptr;

    qt_ft_grays_raster.raster_reset(*grayRaster.data(), rasterPoolBase, rasterPoolSize);

    void *data = userData;

    QT_FT_BBox clip_box = { deviceRect.x(),
                            deviceRect.y(),
                            deviceRect.x() + deviceRect.width(),
                            deviceRect.y() + deviceRect.height() };

    QT_FT_Raster_Params rasterParams;
    rasterParams.target = nullptr;
    rasterParams.source = outline;
    rasterParams.flags = QT_FT_RASTER_FLAG_CLIP;
    rasterParams.gray_spans = nullptr;
    rasterParams.black_spans = nullptr;
    rasterParams.bit_test = nullptr;
    rasterParams.bit_set = nullptr;
    rasterParams.user = data;
    rasterParams.clip_box = clip_box;

    bool done = false;
    int error;

    int rendered_spans = 0;

    while (!done) {

        rasterParams.flags |= (QT_FT_RASTER_FLAG_AA | QT_FT_RASTER_FLAG_DIRECT);
        rasterParams.gray_spans = callback;
        rasterParams.skip_spans = rendered_spans;
        error = qt_ft_grays_raster.raster_render(*grayRaster.data(), &rasterParams);

        // Out of memory, reallocate some more and try again...
        if (error == -6) { // ErrRaster_OutOfMemory from qgrayraster.c
            rasterPoolSize *= 2;
            if (rasterPoolSize > 1024 * 1024) {
                qWarning("QPainter: Rasterization of primitive failed");
                break;
            }

            rendered_spans += q_gray_rendered_spans(*grayRaster.data());

            free(rasterPoolOnHeap);
            rasterPoolOnHeap = (uchar *)malloc(rasterPoolSize + 0xf);

            Q_CHECK_PTR(rasterPoolOnHeap); // note: we just freed the old rasterPoolBase. I hope it's not fatal.

            rasterPoolBase = alignAddress(rasterPoolOnHeap, 0xf);

            qt_ft_grays_raster.raster_done(*grayRaster.data());
            qt_ft_grays_raster.raster_new(grayRaster.data());
            qt_ft_grays_raster.raster_reset(*grayRaster.data(), rasterPoolBase, rasterPoolSize);
        } else {
            done = true;
        }
    }

    free(rasterPoolOnHeap);
}